

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_deep_copy(REF_NODE *ref_node_ptr,REF_MPI ref_mpi,REF_NODE original)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  REF_INT *pRVar4;
  REF_DBL *pRVar5;
  REF_NODE ref_node;
  int local_30;
  REF_INT i;
  REF_INT node;
  REF_INT max;
  REF_NODE original_local;
  REF_MPI ref_mpi_local;
  REF_NODE *ref_node_ptr_local;
  
  pRVar2 = (REF_NODE)malloc(0xa0);
  *ref_node_ptr = pRVar2;
  if (*ref_node_ptr == (REF_NODE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x6c,
           "ref_node_deep_copy","malloc *ref_node_ptr of REF_NODE_STRUCT NULL");
    ref_node_ptr_local._4_4_ = 2;
  }
  else {
    pRVar2 = *ref_node_ptr;
    iVar1 = original->max;
    pRVar2->n = original->n;
    pRVar2->max = iVar1;
    if (iVar1 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x74,
             "ref_node_deep_copy","malloc ref_node->global of REF_GLOB negative");
      ref_node_ptr_local._4_4_ = 1;
    }
    else {
      pRVar3 = (REF_GLOB *)malloc((long)iVar1 << 3);
      pRVar2->global = pRVar3;
      if (pRVar2->global == (REF_GLOB *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x74
               ,"ref_node_deep_copy","malloc ref_node->global of REF_GLOB NULL");
        ref_node_ptr_local._4_4_ = 2;
      }
      else {
        pRVar2->blank = original->blank;
        for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
          pRVar2->global[local_30] = original->global[local_30];
        }
        if (iVar1 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x79,"ref_node_deep_copy","malloc ref_node->sorted_global of REF_GLOB negative");
          ref_node_ptr_local._4_4_ = 1;
        }
        else {
          pRVar3 = (REF_GLOB *)malloc((long)iVar1 << 3);
          pRVar2->sorted_global = pRVar3;
          if (pRVar2->sorted_global == (REF_GLOB *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x79,"ref_node_deep_copy","malloc ref_node->sorted_global of REF_GLOB NULL");
            ref_node_ptr_local._4_4_ = 2;
          }
          else if (iVar1 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x7a,"ref_node_deep_copy","malloc ref_node->sorted_local of REF_INT negative");
            ref_node_ptr_local._4_4_ = 1;
          }
          else {
            pRVar4 = (REF_INT *)malloc((long)iVar1 << 2);
            pRVar2->sorted_local = pRVar4;
            if (pRVar2->sorted_local == (REF_INT *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x7a,"ref_node_deep_copy","malloc ref_node->sorted_local of REF_INT NULL");
              ref_node_ptr_local._4_4_ = 2;
            }
            else {
              for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
                pRVar2->sorted_global[local_30] = original->sorted_global[local_30];
              }
              for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
                pRVar2->sorted_local[local_30] = original->sorted_local[local_30];
              }
              if (iVar1 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x80,"ref_node_deep_copy","malloc ref_node->part of REF_INT negative");
                ref_node_ptr_local._4_4_ = 1;
              }
              else {
                pRVar4 = (REF_INT *)malloc((long)iVar1 << 2);
                pRVar2->part = pRVar4;
                if (pRVar2->part == (REF_INT *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x80,"ref_node_deep_copy","malloc ref_node->part of REF_INT NULL");
                  ref_node_ptr_local._4_4_ = 2;
                }
                else {
                  for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
                    pRVar2->part[local_30] = original->part[local_30];
                  }
                  if (iVar1 < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x84,"ref_node_deep_copy","malloc ref_node->age of REF_INT negative");
                    ref_node_ptr_local._4_4_ = 1;
                  }
                  else {
                    pRVar4 = (REF_INT *)malloc((long)iVar1 << 2);
                    pRVar2->age = pRVar4;
                    if (pRVar2->age == (REF_INT *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                             ,0x84,"ref_node_deep_copy","malloc ref_node->age of REF_INT NULL");
                      ref_node_ptr_local._4_4_ = 2;
                    }
                    else {
                      for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
                        pRVar2->age[local_30] = original->age[local_30];
                      }
                      if (iVar1 * 0xf < 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                               ,0x88,"ref_node_deep_copy",
                               "malloc ref_node->real of REF_DBL negative");
                        ref_node_ptr_local._4_4_ = 1;
                      }
                      else {
                        pRVar5 = (REF_DBL *)malloc((long)(iVar1 * 0xf) << 3);
                        pRVar2->real = pRVar5;
                        if (pRVar2->real == (REF_DBL *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                 ,0x88,"ref_node_deep_copy","malloc ref_node->real of REF_DBL NULL")
                          ;
                          ref_node_ptr_local._4_4_ = 2;
                        }
                        else {
                          for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
                            for (ref_node._4_4_ = 0; ref_node._4_4_ < 0xf;
                                ref_node._4_4_ = ref_node._4_4_ + 1) {
                              pRVar2->real[ref_node._4_4_ + local_30 * 0xf] =
                                   original->real[ref_node._4_4_ + local_30 * 0xf];
                            }
                          }
                          pRVar2->naux = original->naux;
                          pRVar2->aux = (REF_DBL *)0x0;
                          if (0 < original->naux) {
                            fflush(_stdout);
                            if (0 < pRVar2->naux * pRVar2->max) {
                              pRVar5 = (REF_DBL *)
                                       realloc(pRVar2->aux,(long)(pRVar2->naux * pRVar2->max) << 3);
                              pRVar2->aux = pRVar5;
                            }
                            if (pRVar2->aux == (REF_DBL *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                     ,0x91,"ref_node_deep_copy","realloc ref_node->aux NULL");
                              printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
                                     (ulong)(uint)(pRVar2->naux * pRVar2->max),
                                     (long)(pRVar2->naux * pRVar2->max),8,
                                     (long)(pRVar2->naux * pRVar2->max) << 3);
                              return 2;
                            }
                            for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
                              for (ref_node._4_4_ = 0; ref_node._4_4_ < pRVar2->naux;
                                  ref_node._4_4_ = ref_node._4_4_ + 1) {
                                pRVar2->aux[ref_node._4_4_ + pRVar2->naux * local_30] =
                                     original->aux[ref_node._4_4_ + original->naux * local_30];
                              }
                            }
                          }
                          pRVar2->ref_mpi = ref_mpi;
                          pRVar2->n_unused = original->n_unused;
                          pRVar2->max_unused = original->max_unused;
                          if (pRVar2->max_unused < 0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                   ,0x9b,"ref_node_deep_copy",
                                   "malloc ref_node->unused_global of REF_GLOB negative");
                            ref_node_ptr_local._4_4_ = 1;
                          }
                          else {
                            pRVar3 = (REF_GLOB *)malloc((long)pRVar2->max_unused << 3);
                            pRVar2->unused_global = pRVar3;
                            if (pRVar2->unused_global == (REF_GLOB *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                     ,0x9b,"ref_node_deep_copy",
                                     "malloc ref_node->unused_global of REF_GLOB NULL");
                              ref_node_ptr_local._4_4_ = 2;
                            }
                            else {
                              for (ref_node._4_4_ = 0; ref_node._4_4_ < pRVar2->n_unused;
                                  ref_node._4_4_ = ref_node._4_4_ + 1) {
                                pRVar2->unused_global[ref_node._4_4_] =
                                     original->unused_global[ref_node._4_4_];
                              }
                              pRVar2->old_n_global = original->old_n_global;
                              pRVar2->new_n_global = original->new_n_global;
                              pRVar2->min_volume = original->min_volume;
                              pRVar2->min_uv_area = original->min_uv_area;
                              pRVar2->same_normal_tol = original->same_normal_tol;
                              pRVar2->tet_quality = original->tet_quality;
                              pRVar2->tri_quality = original->tri_quality;
                              pRVar2->ratio_method = original->ratio_method;
                              ref_node_ptr_local._4_4_ = 0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return ref_node_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_deep_copy(REF_NODE *ref_node_ptr, REF_MPI ref_mpi,
                                      REF_NODE original) {
  REF_INT max, node, i;
  REF_NODE ref_node;

  ref_malloc(*ref_node_ptr, 1, REF_NODE_STRUCT);
  ref_node = *ref_node_ptr;

  max = ref_node_max(original);

  ref_node_n(ref_node) = ref_node_n(original);
  ref_node_max(ref_node) = max;

  ref_malloc(ref_node->global, max, REF_GLOB);
  ref_node->blank = original->blank;
  for (node = 0; node < max; node++)
    ref_node->global[node] = original->global[node];

  ref_malloc(ref_node->sorted_global, max, REF_GLOB);
  ref_malloc(ref_node->sorted_local, max, REF_INT);
  for (node = 0; node < max; node++)
    ref_node->sorted_global[node] = original->sorted_global[node];
  for (node = 0; node < max; node++)
    ref_node->sorted_local[node] = original->sorted_local[node];

  ref_malloc(ref_node->part, max, REF_INT);
  for (node = 0; node < max; node++)
    ref_node_part(ref_node, node) = ref_node_part(original, node);

  ref_malloc(ref_node->age, max, REF_INT);
  for (node = 0; node < max; node++)
    ref_node_age(ref_node, node) = ref_node_age(original, node);

  ref_malloc(ref_node->real, REF_NODE_REAL_PER * max, REF_DBL);
  for (node = 0; node < max; node++)
    for (i = 0; i < REF_NODE_REAL_PER; i++)
      ref_node_real(ref_node, i, node) = ref_node_real(original, i, node);

  ref_node_naux(ref_node) = ref_node_naux(original);
  ref_node->aux = NULL;
  if (ref_node_naux(original) > 0) {
    ref_realloc(ref_node->aux, ref_node_naux(ref_node) * ref_node_max(ref_node),
                REF_DBL);
    for (node = 0; node < max; node++)
      for (i = 0; i < ref_node_naux(ref_node); i++)
        ref_node_aux(ref_node, i, node) = ref_node_aux(original, i, node);
  }

  ref_node_mpi(ref_node) = ref_mpi; /* reference only */

  ref_node->n_unused = original->n_unused;
  ref_node->max_unused = original->max_unused;
  ref_malloc(ref_node->unused_global, ref_node_max_unused(ref_node), REF_GLOB);
  for (i = 0; i < ref_node_n_unused(ref_node); i++)
    ref_node->unused_global[i] = original->unused_global[i];

  ref_node->old_n_global = original->old_n_global;
  ref_node->new_n_global = original->new_n_global;

  ref_node->min_volume = original->min_volume;
  ref_node->min_uv_area = original->min_uv_area;
  ref_node->same_normal_tol = original->same_normal_tol;

  ref_node->tet_quality = original->tet_quality;
  ref_node->tri_quality = original->tri_quality;
  ref_node->ratio_method = original->ratio_method;

  return REF_SUCCESS;
}